

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VMOV_from_gp(DisasContext_conflict1 *s,arg_VMOV_from_gp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  uint32_t pass_00;
  TCGv_i32 ret;
  TCGv_i32 pTVar4;
  uint32_t offset;
  int pass;
  TCGv_i32 tmp2;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_VMOV_from_gp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->size == 2) {
    _Var1 = isar_feature_aa32_fpsp_v2(s->isar);
    if (_Var1) {
LAB_007ac28f:
      _Var1 = isar_feature_aa32_simd_r32(s->isar);
      if ((!_Var1) && ((a->vn & 0x10U) != 0)) {
        return false;
      }
      uVar3 = a->index << ((byte)a->size & 0x1f);
      pass_00 = extract32(uVar3,2,1);
      uVar3 = extract32(uVar3,0,2);
      _Var1 = vfp_access_check(s);
      if (!_Var1) {
        return true;
      }
      ret = load_reg(s,a->rt);
      if (a->size == 0) {
        pTVar4 = neon_load_reg(tcg_ctx_00,a->vn,pass_00);
        tcg_gen_deposit_i32_aarch64(tcg_ctx_00,ret,pTVar4,ret,uVar3 << 3,8);
        tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      }
      else if (a->size == 1) {
        pTVar4 = neon_load_reg(tcg_ctx_00,a->vn,pass_00);
        tcg_gen_deposit_i32_aarch64(tcg_ctx_00,ret,pTVar4,ret,uVar3 << 3,0x10);
        tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      }
      neon_store_reg(tcg_ctx_00,a->vn,pass_00,ret);
      return true;
    }
  }
  else {
    iVar2 = arm_dc_feature(s,8);
    if (iVar2 != 0) goto LAB_007ac28f;
  }
  return false;
}

Assistant:

static bool trans_VMOV_from_gp(DisasContext *s, arg_VMOV_from_gp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VMOV general purpose register to scalar */
    TCGv_i32 tmp, tmp2;
    int pass;
    uint32_t offset;

    /* SIZE == 2 is a VFP instruction; otherwise NEON.  */
    if (a->size == 2
        ? !dc_isar_feature(aa32_fpsp_v2, s)
        : !arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    offset = a->index << a->size;
    pass = extract32(offset, 2, 1);
    offset = extract32(offset, 0, 2) * 8;

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = load_reg(s, a->rt);
    switch (a->size) {
    case 0:
        tmp2 = neon_load_reg(tcg_ctx, a->vn, pass);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, offset, 8);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        break;
    case 1:
        tmp2 = neon_load_reg(tcg_ctx, a->vn, pass);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, offset, 16);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        break;
    case 2:
        break;
    }
    neon_store_reg(tcg_ctx, a->vn, pass, tmp);

    return true;
}